

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall CServer::CServer(CServer *this)

{
  (this->super_IServer).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IServer).super_IInterface._vptr_IInterface = (_func_int **)&PTR__CServer_0015cd30;
  CSnapshotDelta::CSnapshotDelta(&this->m_SnapshotDelta);
  CSnapIDPool::Reset(&this->m_IDPool);
  CNetServer::CNetServer(&this->m_NetServer);
  CNetRecvUnpacker::Clear(&(this->m_Econ).m_NetConsole.m_RecvUnpacker);
  (this->m_ServerBan).super_CNetBan._vptr_CNetBan = (_func_int **)&PTR__CNetBan_0015ce08;
  CDemoRecorder::CDemoRecorder(&this->m_DemoRecorder,&this->m_SnapshotDelta);
  CRegister::CRegister(&this->m_Register);
  this->m_pGameServer = (IGameServer *)0x0;
  (this->super_IServer).m_CurrentGameTick = 0;
  (this->super_IServer).m_TickSpeed = 0x32;
  this->m_RunServer = true;
  str_copy(this->m_aShutdownReason,"Server shutdown",0x80);
  this->m_pCurrentMapData = (uchar *)0x0;
  this->m_CurrentMapSize = 0;
  this->m_MapReload = false;
  this->m_pMapListHeap = (CHeap *)0x0;
  this->m_pLastMapEntry = (CMapListEntry *)0x0;
  *(undefined8 *)((long)&this->m_pLastMapEntry + 4) = 0;
  *(undefined8 *)((long)&this->m_pFirstMapEntry + 4) = 0;
  this->m_RconClientID = -1;
  this->m_RconAuthLevel = 2;
  this->m_RconPasswordSet = 0;
  this->m_GeneratedRconPassword = 0;
  Init(this);
  return;
}

Assistant:

CServer::CServer() : m_DemoRecorder(&m_SnapshotDelta)
{
	m_TickSpeed = SERVER_TICK_SPEED;

	m_pGameServer = 0;

	m_CurrentGameTick = 0;
	m_RunServer = true;

	str_copy(m_aShutdownReason, "Server shutdown", sizeof(m_aShutdownReason));

	m_pCurrentMapData = 0;
	m_CurrentMapSize = 0;

	m_NumMapEntries = 0;
	m_pFirstMapEntry = 0;
	m_pLastMapEntry = 0;
	m_pMapListHeap = 0;

	m_MapReload = false;

	m_RconClientID = IServer::RCON_CID_SERV;
	m_RconAuthLevel = AUTHED_ADMIN;

	m_RconPasswordSet = 0;
	m_GeneratedRconPassword = 0;

	Init();
}